

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2LFO::set(V2LFO *this,syVLFO *para)

{
  int iVar1;
  float fVar2;
  
  this->mode = (int)para->mode;
  this->sync = (int)para->sync != 0;
  this->eg = (int)para->egmode != 0;
  fVar2 = exp2f((para->rate * 0.0078125 + -1.0) * 10.0);
  this->freq = (int)(fVar2 * 1.0737418e+09);
  this->cphase = (int)(para->phase * 0.0078125 * 2.1474836e+09) * 2;
  iVar1 = (int)para->pol;
  if (iVar1 == 2) {
    fVar2 = para->amp;
    this->gain = fVar2;
    fVar2 = fVar2 * -0.5;
  }
  else {
    if (iVar1 == 1) {
      fVar2 = -para->amp;
    }
    else {
      if (iVar1 != 0) {
        return;
      }
      fVar2 = para->amp;
    }
    this->gain = fVar2;
    fVar2 = 0.0;
  }
  this->dc = fVar2;
  return;
}

Assistant:

void set(const syVLFO *para)
    {
        mode = (int)para->mode;
        sync = (int)para->sync != 0;
        eg = (int)para->egmode != 0;
        freq = (int)(0.5f * fc32bit * calcfreq(para->rate / 128.0f));
        cphase = ftou32(para->phase / 128.0f);

        switch ((int)para->pol)
        {
        case 0: // +
            COVER("LFO pol +");
            gain = para->amp;
            dc = 0.0f;
            break;

        case 1: // -
            COVER("LFO pol -");
            gain = -para->amp;
            dc = 0.0f;
            break;

        case 2: // +/-
            COVER("LFO pol +/-");
            gain = para->amp;
            dc = -0.5f * para->amp;
            break;
        }
    }